

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O2

int Curl_timestrcmp(char *a,char *b)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  
  if (b == (char *)0x0 || a == (char *)0x0) {
    return (int)(a != (char *)0x0 || b != (char *)0x0);
  }
  lVar3 = 0;
  uVar2 = 0;
  do {
    pbVar1 = (byte *)(b + lVar3);
    uVar2 = (int)(char)(*pbVar1 ^ a[lVar3]) | uVar2;
    if (a[lVar3] == 0) {
      return uVar2;
    }
    lVar3 = lVar3 + 1;
  } while (*pbVar1 != 0);
  return uVar2;
}

Assistant:

int Curl_timestrcmp(const char *a, const char *b)
{
  int match = 0;
  int i = 0;

  if(a && b) {
    while(1) {
      match |= a[i]^b[i];
      if(!a[i] || !b[i])
        break;
      i++;
    }
  }
  else
    return a || b;
  return match;
}